

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  Parse *pPVar4;
  WhereLoop *pWVar5;
  ulong uVar6;
  ulong uVar7;
  WherePath *pWVar8;
  WhereInfo *pWInfo_00;
  byte bVar9;
  i8 iVar10;
  LogEst LVar11;
  uint uVar12;
  int extraout_EAX;
  WhereLoop ***pppWVar13;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  LogEst *pLVar14;
  WhereLoop **ppWVar15;
  short sVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  ushort uVar23;
  undefined6 in_register_00000032;
  WherePath *pWVar24;
  ExprList *pOrderBy;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  WherePath *pPath;
  WherePath *pWVar29;
  Bitmask revMask;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  uint local_bc;
  WhereLoop **local_b8;
  WherePath *local_b0;
  WhereInfo *local_a8;
  uint local_9c;
  undefined8 local_98;
  long local_90;
  int local_88;
  int local_84;
  undefined4 local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  Parse *local_70;
  ulong local_68;
  WherePath *local_60;
  ulong local_58;
  LogEst *local_50;
  WhereLoop **local_48;
  WherePath *local_40;
  size_t local_38;
  
  local_98 = CONCAT62(in_register_00000032,nRowEst);
  pPVar4 = pWInfo->pParse;
  bVar9 = pWInfo->nLevel;
  uVar12 = (uint)bVar9;
  lVar18 = (ulong)(uVar12 != 2) * 5 + 5;
  if (uVar12 < 2) {
    lVar18 = 1;
  }
  local_dc = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_dc = pWInfo->pOrderBy->nExpr;
  }
  iVar21 = (int)lVar18 * 2;
  lVar20 = (long)local_dc;
  local_a8 = pWInfo;
  local_b0 = (WherePath *)
             sqlite3DbMallocRawNN
                       (pPVar4->db,
                        (long)(int)(((uint)bVar9 * 8 + 0x20) * iVar21 + (int)(lVar20 * 2)));
  if (local_b0 == (WherePath *)0x0) {
    return 0;
  }
  uVar25 = (ulong)(uint)((int)lVar18 << 5);
  pPath = (WherePath *)((long)&local_b0->maskLoop + uVar25);
  puVar1 = (undefined8 *)((long)&local_b0->nRow + uVar25);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_b0->maskLoop + uVar25);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_b8 = (WhereLoop **)((long)&pPath->maskLoop + uVar25);
  pppWVar13 = &local_b0->aLoop;
  for (; 0 < iVar21; iVar21 = iVar21 + -1) {
    *pppWVar13 = local_b8;
    pppWVar13 = pppWVar13 + 4;
    local_b8 = (WhereLoop **)((long)local_b8 + (ulong)((uint)bVar9 * 8));
  }
  local_90 = lVar18;
  local_70 = pPVar4;
  if (local_dc == 0) {
    local_b8 = (WhereLoop **)0x0;
  }
  else {
    memset(local_b8,0,lVar20 * 2);
  }
  LVar11 = 0x30;
  if (local_70->nQueryLoop < 0x30) {
    LVar11 = (LogEst)local_70->nQueryLoop;
  }
  pPath->nRow = LVar11;
  if (local_dc != 0) {
    pPath->isOrdered = -((ulong)bVar9 != 0) | (byte)local_dc;
  }
  local_48 = &local_a8->pLoops;
  local_88 = (int)local_98 + -10;
  local_84 = (int)local_98 + -0x32;
  local_68 = (ulong)uVar12;
  uVar25 = 0;
  uVar12 = 1;
  uVar26 = 0;
  uVar27 = 0;
  uVar28 = 0;
  lVar18 = local_90;
  local_60 = local_b0;
  local_58 = (ulong)bVar9;
  do {
    uVar6 = local_58;
    pWVar29 = local_60;
    pPVar4 = local_70;
    pWInfo_00 = local_a8;
    if (uVar25 == local_68) {
      if (uVar12 == 0) {
        sqlite3ErrorMsg(local_70,"no query solution");
      }
      else {
        pWVar8 = pPath;
        for (lVar18 = 1; lVar18 < (int)uVar12; lVar18 = lVar18 + 1) {
          pWVar24 = pWVar8 + 1;
          if (pPath->rCost <= pWVar8[1].rCost) {
            pWVar24 = pPath;
          }
          pPath = pWVar24;
          pWVar8 = pWVar8 + 1;
        }
        ppWVar15 = &local_a8->a[0].pWLoop;
        for (uVar25 = 0; local_68 != uVar25; uVar25 = uVar25 + 1) {
          pWVar5 = pPath->aLoop[uVar25];
          *ppWVar15 = pWVar5;
          bVar9 = pWVar5->iTab;
          *(byte *)(ppWVar15 + -4) = bVar9;
          *(int *)((long)ppWVar15 + -0x5c) = local_a8->pTabList->a[bVar9].iCursor;
          ppWVar15 = ppWVar15 + 0xe;
        }
        if (((((local_a8->wctrlFlags & 0x180) == 0x100) && ((short)local_98 != 0)) &&
            (local_a8->eDistinct == '\0')) &&
           (iVar10 = wherePathSatisfiesOrderBy
                               (local_a8,local_a8->pResultSet,pPath,0x80,(short)local_58 - 1,
                                pPath->aLoop[local_58 - 1],&revMask),
           pWInfo_00->pResultSet->nExpr == (int)iVar10)) {
          pWInfo_00->eDistinct = '\x02';
        }
        bVar9 = pWInfo_00->field_0x44;
        pWInfo_00->field_0x44 = bVar9 & 0xfb;
        pOrderBy = pWInfo_00->pOrderBy;
        if (pOrderBy != (ExprList *)0x0) {
          cVar2 = pPath->isOrdered;
          pWInfo_00->nOBSat = cVar2;
          uVar23 = pWInfo_00->wctrlFlags;
          uVar12 = (uint)uVar23;
          iVar21 = (int)uVar6;
          if ((char)uVar23 < '\0') {
            if (pOrderBy->nExpr == (int)cVar2) {
              pWInfo_00->eDistinct = '\x02';
            }
          }
          else {
            pWInfo_00->revMask = pPath->revLoop;
            if (cVar2 < '\x01') {
              pWInfo_00->nOBSat = '\0';
              if (uVar6 != 0) {
                uVar28 = pPath->aLoop[iVar21 - 1U]->wsFlags;
                if ((~uVar28 & 0x104) != 0 && (uVar28 >> 0xc & 1) == 0) {
                  revMask = 0;
                  iVar10 = wherePathSatisfiesOrderBy
                                     (pWInfo_00,pOrderBy,pPath,0x800,(u16)(iVar21 - 1U),
                                      pPath->aLoop[iVar21 - 1U],&revMask);
                  pOrderBy = pWInfo_00->pOrderBy;
                  if (pOrderBy->nExpr == (int)iVar10) {
                    pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 4;
                    pWInfo_00->revMask = revMask;
                  }
                  uVar12 = (uint)pWInfo_00->wctrlFlags;
                }
              }
            }
            else if (((uVar23 & 3) != 0 && iVar21 != 0) && cVar2 == '\x01') {
              pWInfo_00->field_0x44 = bVar9 | 4;
            }
          }
          if ((((uVar12 >> 9 & 1) != 0) && (uVar6 != 0)) &&
             (pOrderBy->nExpr == (int)pWInfo_00->nOBSat)) {
            revMask = 0;
            iVar10 = wherePathSatisfiesOrderBy
                               (pWInfo_00,pOrderBy,pPath,0,(u16)(iVar21 - 1U),
                                pPath->aLoop[iVar21 - 1U],&revMask);
            if (pWInfo_00->pOrderBy->nExpr == (int)iVar10) {
              pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 8;
              pWInfo_00->revMask = revMask;
            }
          }
        }
        pWInfo_00->nRowOut = pPath->nRow;
      }
      sqlite3DbFreeNN(pPVar4->db,pWVar29);
      return extraout_EAX;
    }
    local_38 = uVar25 * 8;
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    local_50 = &local_b0[1].rUnsorted;
    local_7c = (uint)uVar25 & 0xffff;
    local_d0 = uVar25;
    local_78 = uVar12;
    local_40 = pPath;
    uVar12 = 0;
    for (uVar19 = 0; ppWVar15 = local_48, uVar19 != local_78; uVar19 = uVar19 + 1) {
      while (pWVar5 = *ppWVar15, pWVar5 != (WhereLoop *)0x0) {
        uVar6 = pPath->maskLoop;
        if ((((pWVar5->prereq & ~uVar6) == 0) && (uVar7 = pWVar5->maskSelf, (uVar7 & uVar6) == 0))
           && ((sVar16 = pPath->nRow, (pWVar5->wsFlags & 0x4000) == 0 || (2 < sVar16)))) {
          local_d8 = uVar26;
          local_c8 = uVar27;
          local_9c = uVar12;
          LVar11 = sqlite3LogEstAdd(pWVar5->rSetup,pWVar5->rRun + sVar16);
          LVar11 = sqlite3LogEstAdd(LVar11,pPath->rUnsorted);
          uVar25 = CONCAT62(extraout_var,LVar11) & 0xffffffff;
          uVar23 = sVar16 + pWVar5->nOut;
          bVar9 = pPath->isOrdered;
          if ((char)bVar9 < '\0') {
            revMask = 0;
            local_bc = (uint)CONCAT62(extraout_var,LVar11);
            bVar9 = wherePathSatisfiesOrderBy
                              (local_a8,local_a8->pOrderBy,pPath,local_a8->wctrlFlags,(u16)local_7c,
                               pWVar5,&revMask);
            uVar25 = (ulong)local_bc;
          }
          else {
            revMask = pPath->revLoop;
          }
          iVar21 = local_dc - (char)bVar9;
          uVar12 = (uint)uVar25;
          if ((iVar21 == 0 || local_dc < (char)bVar9) || (char)bVar9 < '\0') {
            LVar11 = (short)uVar25 + -2;
          }
          else {
            local_74 = (uint)uVar23;
            sVar16 = *(short *)((long)local_b8 + (ulong)bVar9 * 2);
            if (sVar16 == 0) {
              local_bc = uVar12;
              LVar11 = sqlite3LogEst((long)((iVar21 * 100) / local_dc));
              local_80 = (undefined4)CONCAT62(extraout_var_00,LVar11);
              uVar12._0_2_ = local_a8->wctrlFlags;
              uVar12._2_2_ = local_a8->iLimit;
              if (((uVar12 >> 0xe & 1) == 0) ||
                 (sVar16 = local_a8->iLimit, (short)local_98 <= local_a8->iLimit)) {
                sVar16 = (short)local_98;
                if ((uVar12 & 0x100) != 0) {
                  sVar16 = (short)local_88;
                }
                if ((short)local_98 < 0xb) {
                  sVar16 = (short)local_98;
                }
              }
              LVar11 = estLog(sVar16);
              sVar16 = (short)local_80 + LVar11 + (short)local_84;
              *(short *)((long)local_b8 + (ulong)bVar9 * 2) = sVar16;
              uVar25 = (ulong)local_bc;
            }
            LVar11 = (LogEst)uVar25;
            uVar23 = sqlite3LogEstAdd(LVar11,sVar16);
            uVar12 = uVar23 + 5;
            uVar23 = (ushort)local_74;
            lVar18 = local_90;
          }
          sVar16 = (short)uVar12;
          if ((local_d0 == 0) && ((pWVar5->wsFlags & 0x2000000) != 0)) {
            sVar16 = sVar16 + -10;
            uVar23 = uVar23 - 0x1e;
          }
          pWVar29 = local_b0;
          uVar17 = 0;
          if (0 < (int)local_9c) {
            uVar17 = local_9c;
          }
          while( true ) {
            uVar22 = (uint)lVar18;
            uVar25 = local_d0;
            uVar26 = local_d8;
            uVar27 = local_c8;
            uVar12 = local_9c;
            if (uVar17 == 0) break;
            if ((pWVar29->maskLoop == (uVar7 | uVar6)) && (-1 < (char)(pWVar29->isOrdered ^ bVar9)))
            {
              if ((pWVar29->rCost < sVar16) ||
                 ((pWVar29->rCost == sVar16 &&
                  ((pWVar29->nRow < (short)uVar23 ||
                   ((pWVar29->nRow == uVar23 && (pWVar29->rUnsorted <= LVar11))))))))
              goto LAB_001a74ec;
              goto LAB_001a7401;
            }
            pWVar29 = pWVar29 + 1;
            uVar17 = uVar17 - 1;
          }
          uVar17 = local_9c;
          if ((int)uVar22 <= (int)local_9c) {
            if (((short)local_c8 < sVar16) ||
               ((uVar17 = uVar28, sVar16 == (short)local_c8 && ((short)local_d8 <= LVar11))))
            goto LAB_001a74ec;
          }
          uVar12 = local_9c + ((int)local_9c < (int)uVar22);
          pWVar29 = local_b0 + (int)uVar17;
LAB_001a7401:
          pWVar29->maskLoop = pWVar5->maskSelf | pPath->maskLoop;
          pWVar29->revLoop = revMask;
          pWVar29->nRow = uVar23;
          pWVar29->rCost = sVar16;
          pWVar29->rUnsorted = LVar11;
          pWVar29->isOrdered = bVar9;
          memcpy(pWVar29->aLoop,pPath->aLoop,local_38);
          pWVar29->aLoop[local_d0] = pWVar5;
          uVar25 = local_d0;
          uVar26 = local_d8;
          uVar27 = local_c8;
          if ((int)uVar22 <= (int)uVar12) {
            uVar26 = (ulong)(ushort)local_b0->nRow;
            uVar27 = (ulong)(ushort)local_b0->rCost;
            uVar28 = 0;
            pLVar14 = local_50;
            for (uVar17 = 1; uVar17 < uVar22; uVar17 = uVar17 + 1) {
              uVar23 = pLVar14[-1];
              if ((short)(ushort)uVar27 < (short)uVar23) {
                uVar3 = *pLVar14;
LAB_001a748c:
                uVar26 = (ulong)uVar3;
                uVar27 = (ulong)uVar23;
                uVar28 = uVar17;
              }
              else if ((uVar23 == (ushort)uVar27) &&
                      (uVar3 = *pLVar14, (short)uVar26 < (short)uVar3)) goto LAB_001a748c;
              pLVar14 = pLVar14 + 0x10;
            }
          }
        }
LAB_001a74ec:
        ppWVar15 = &pWVar5->pNextLoop;
      }
      pPath = pPath + 1;
    }
    uVar25 = uVar25 + 1;
    pPath = local_b0;
    local_b0 = local_40;
  } while( true );
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* TUNING:  A full-scan of a VIEW or subquery in the outer loop
        ** is not so bad. */
        if( iLoop==0 && (pWLoop->wsFlags & WHERE_VIEWSCAN)!=0 ){
          rCost += -10;
          nOut += -30;
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}